

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

bool __thiscall re2::SparseArray<int>::has_index(SparseArray<int> *this,int i)

{
  const_reference pvVar1;
  bool local_29;
  int i_local;
  SparseArray<int> *this_local;
  
  if (i < 0) {
    __assert_fail("(i) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x134,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  if (i < this->max_size_) {
    if ((uint)i < (uint)this->max_size_) {
      local_29 = false;
      if ((uint)this->sparse_to_dense_[i] < (uint)this->size_) {
        pvVar1 = std::
                 vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                 ::operator[](&this->dense_,(long)this->sparse_to_dense_[i]);
        local_29 = pvVar1->index_ == i;
      }
      this_local._7_1_ = local_29;
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("(i) < (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x135,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
}

Assistant:

bool SparseArray<Value>::has_index(int i) const {
  DCHECK_GE(i, 0);
  DCHECK_LT(i, max_size_);
  if (static_cast<uint>(i) >= static_cast<uint>(max_size_)) {
    return false;
  }
  // Unsigned comparison avoids checking sparse_to_dense_[i] < 0.
  return (uint)sparse_to_dense_[i] < (uint)size_ && 
    dense_[sparse_to_dense_[i]].index_ == i;
}